

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpztetrahedron.cpp
# Opt level: O0

void pztopology::TPZTetrahedron::ComputeHDivDirections<double>
               (TPZFMatrix<double> *gradx,TPZFMatrix<double> *directions)

{
  double dVar1;
  double dVar2;
  _func_int **pp_Var3;
  double *pdVar4;
  double dVar5;
  int i_2;
  int i_1;
  int i;
  TPZManVector<double,_3> v3;
  TPZManVector<double,_3> v2;
  TPZManVector<double,_3> v1;
  double detjac;
  TPZManVector<double,_3> *in_stack_fffffffffffff880;
  _func_int **in_stack_fffffffffffff890;
  double *in_stack_fffffffffffff898;
  TPZFMatrix<double> *in_stack_fffffffffffff8a0;
  TPZFMatrix<double> *in_stack_fffffffffffff9a0;
  int local_dc;
  int local_d8;
  int local_d4;
  TPZVec<double> local_d0 [2];
  TPZVec<double> local_88;
  TPZVec<double> local_50;
  double local_18;
  
  local_18 = TPZAxesTools<double>::ComputeDetjac(in_stack_fffffffffffff9a0);
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898
            );
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898
            );
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898
            );
  for (local_d4 = 0; local_d4 < 3; local_d4 = local_d4 + 1) {
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    dVar5 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[](&local_50,(long)local_d4);
    *pdVar4 = dVar5 * 6.0;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    dVar5 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[](&local_88,(long)local_d4);
    *pdVar4 = dVar5 * 6.0;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    dVar5 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[](local_d0,(long)local_d4);
    *pdVar4 = dVar5 * 6.0;
  }
  for (local_d8 = 0; dVar5 = local_18, local_d8 < 3; local_d8 = local_d8 + 1) {
    pdVar4 = TPZVec<double>::operator[](&local_50,(long)local_d8);
    dVar1 = local_18;
    *pdVar4 = *pdVar4 / dVar5;
    pdVar4 = TPZVec<double>::operator[](&local_88,(long)local_d8);
    dVar5 = local_18;
    *pdVar4 = *pdVar4 / dVar1;
    pdVar4 = TPZVec<double>::operator[](local_d0,(long)local_d8);
    *pdVar4 = *pdVar4 / dVar5;
  }
  for (local_dc = 0; local_dc < 3; local_dc = local_dc + 1) {
    pdVar4 = TPZVec<double>::operator[](local_d0,(long)local_dc);
    dVar5 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    *pdVar4 = -dVar5;
    pdVar4 = TPZVec<double>::operator[](&local_50,(long)local_dc);
    dVar5 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[](local_d0,(long)local_dc);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    *pdVar4 = dVar5 - dVar1;
    pdVar4 = TPZVec<double>::operator[](&local_88,(long)local_dc);
    dVar5 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[](local_d0,(long)local_dc);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    *pdVar4 = dVar5 - dVar1;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    dVar5 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    *pdVar4 = (dVar5 + dVar1) * 0.5;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    dVar5 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    *pdVar4 = (dVar5 + dVar1) * 0.5;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    dVar5 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    *pdVar4 = (dVar5 + dVar1) * 0.5;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    dVar5 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    dVar2 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    *pdVar4 = (dVar5 + dVar1 + dVar2) / 3.0;
    pdVar4 = TPZVec<double>::operator[](&local_88,(long)local_dc);
    dVar5 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    *pdVar4 = -dVar5;
    pdVar4 = TPZVec<double>::operator[](&local_50,(long)local_dc);
    dVar5 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[](&local_88,(long)local_dc);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    *pdVar4 = dVar5 - dVar1;
    pdVar4 = TPZVec<double>::operator[](local_d0,(long)local_dc);
    dVar5 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[](&local_88,(long)local_dc);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    *pdVar4 = dVar5 - dVar1;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    dVar5 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    *pdVar4 = (dVar5 + dVar1) * 0.5;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    dVar5 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    *pdVar4 = (dVar5 + dVar1) * 0.5;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    dVar5 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    *pdVar4 = (dVar5 + dVar1) * 0.5;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    dVar5 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    dVar2 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    *pdVar4 = (dVar5 + dVar1 + dVar2) / 3.0;
    pdVar4 = TPZVec<double>::operator[](&local_50,(long)local_dc);
    dVar5 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    *pdVar4 = dVar5;
    pdVar4 = TPZVec<double>::operator[](&local_88,(long)local_dc);
    dVar5 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    *pdVar4 = dVar5;
    pdVar4 = TPZVec<double>::operator[](local_d0,(long)local_dc);
    dVar5 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    *pdVar4 = dVar5;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    dVar5 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    *pdVar4 = (dVar5 + dVar1) * 0.5;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    dVar5 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    *pdVar4 = (dVar5 + dVar1) * 0.5;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    dVar5 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    *pdVar4 = (dVar5 + dVar1) * 0.5;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    dVar5 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    dVar2 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    *pdVar4 = (dVar5 + dVar1 + dVar2) / 3.0;
    pdVar4 = TPZVec<double>::operator[](&local_50,(long)local_dc);
    dVar5 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    *pdVar4 = -dVar5;
    pdVar4 = TPZVec<double>::operator[](&local_88,(long)local_dc);
    dVar5 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[](&local_50,(long)local_dc);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    *pdVar4 = dVar5 - dVar1;
    pdVar4 = TPZVec<double>::operator[](local_d0,(long)local_dc);
    dVar5 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[](&local_50,(long)local_dc);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    *pdVar4 = dVar5 - dVar1;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    dVar5 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    *pdVar4 = (dVar5 + dVar1) * 0.5;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    dVar5 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    *pdVar4 = (dVar5 + dVar1) * 0.5;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    dVar5 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    *pdVar4 = (dVar5 + dVar1) * 0.5;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    dVar5 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    dVar2 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    *pdVar4 = (dVar5 + dVar1 + dVar2) / 3.0;
    pdVar4 = TPZVec<double>::operator[](&local_50,(long)local_dc);
    dVar5 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    *pdVar4 = dVar5;
    pdVar4 = TPZVec<double>::operator[](&local_88,(long)local_dc);
    dVar5 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[](&local_50,(long)local_dc);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    *pdVar4 = dVar5 - dVar1;
    pdVar4 = TPZVec<double>::operator[](&local_88,(long)local_dc);
    dVar5 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    *pdVar4 = -dVar5;
    pdVar4 = TPZVec<double>::operator[](local_d0,(long)local_dc);
    dVar5 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    *pdVar4 = dVar5;
    pdVar4 = TPZVec<double>::operator[](local_d0,(long)local_dc);
    dVar5 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[](&local_50,(long)local_dc);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    *pdVar4 = dVar5 - dVar1;
    pdVar4 = TPZVec<double>::operator[](local_d0,(long)local_dc);
    dVar5 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[](&local_88,(long)local_dc);
    dVar5 = dVar5 - *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    *pdVar4 = dVar5;
    pdVar4 = TPZVec<double>::operator[](&local_50,(long)local_dc);
    dVar5 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    *pdVar4 = dVar5;
    pdVar4 = TPZVec<double>::operator[](&local_88,(long)local_dc);
    dVar5 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    *pdVar4 = dVar5;
    pdVar4 = TPZVec<double>::operator[](&local_50,(long)local_dc);
    dVar5 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    *pdVar4 = dVar5;
    pdVar4 = TPZVec<double>::operator[](local_d0,(long)local_dc);
    dVar5 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    *pdVar4 = dVar5;
    pdVar4 = TPZVec<double>::operator[](&local_88,(long)local_dc);
    dVar5 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[](&local_50,(long)local_dc);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    *pdVar4 = dVar5 - dVar1;
    pdVar4 = TPZVec<double>::operator[](local_d0,(long)local_dc);
    dVar5 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[](&local_50,(long)local_dc);
    dVar1 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    *pdVar4 = dVar5 - dVar1;
    pdVar4 = TPZVec<double>::operator[](&local_88,(long)local_dc);
    dVar5 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    *pdVar4 = dVar5;
    pdVar4 = TPZVec<double>::operator[](local_d0,(long)local_dc);
    dVar5 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    *pdVar4 = dVar5;
    pdVar4 = TPZVec<double>::operator[](&local_50,(long)local_dc);
    dVar5 = *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                        (int64_t)in_stack_fffffffffffff890);
    *pdVar4 = dVar5;
    in_stack_fffffffffffff8a0 =
         (TPZFMatrix<double> *)TPZVec<double>::operator[](&local_88,(long)local_dc);
    in_stack_fffffffffffff890 =
         (in_stack_fffffffffffff8a0->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
         _vptr_TPZSavable;
    in_stack_fffffffffffff898 =
         TPZFMatrix<double>::operator()
                   (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                    (int64_t)in_stack_fffffffffffff890);
    *in_stack_fffffffffffff898 = (double)in_stack_fffffffffffff890;
    pdVar4 = TPZVec<double>::operator[](local_d0,(long)local_dc);
    pp_Var3 = (_func_int **)*pdVar4;
    in_stack_fffffffffffff880 =
         (TPZManVector<double,_3> *)
         TPZFMatrix<double>::operator()
                   (in_stack_fffffffffffff8a0,(int64_t)in_stack_fffffffffffff898,
                    (int64_t)in_stack_fffffffffffff890);
    (in_stack_fffffffffffff880->super_TPZVec<double>)._vptr_TPZVec = pp_Var3;
  }
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffff880);
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffff880);
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffff880);
  return;
}

Assistant:

void TPZTetrahedron::ComputeHDivDirections(TPZFMatrix<TVar> &gradx, TPZFMatrix<TVar> &directions)
    {
        TVar detjac = TPZAxesTools<TVar>::ComputeDetjac(gradx);
        
        TPZManVector<TVar,3> v1(3),v2(3),v3(3);
        
        for (int i=0; i<3; i++) {
            v1[i] = gradx(i,0)*6.;
            v2[i] = gradx(i,1)*6.;
            v3[i] = gradx(i,2)*6.;
        }
        
        
        /**
         * @file
         * @brief Computing mapped vector with scaling factor equal 1.0.
         * using contravariant piola mapping.
         */
        
        {
            // the above constants are wrong
            for (int i=0; i<3; i++) {
                v1[i] /= detjac;
                v2[i] /= detjac;
                v3[i] /= detjac;
            }
            for (int i=0; i<3; i++)
            {
                
                //face 0
                directions(i,0) = -v3[i];
                directions(i,1) = (v1[i]-v3[i]);
                directions(i,2) = (v2[i]-v3[i]);
                directions(i,3) = (directions(i,0)+directions(i,1))/2.;
                directions(i,4) = (directions(i,1)+directions(i,2))/2.;
                directions(i,5) = (directions(i,0)+directions(i,2))/2.;
                directions(i,6) = (directions(i,3)+directions(i,4)+directions(i,5))/3.;
                //face 1
                directions(i,7) = -v2[i];
                directions(i,8) = (v1[i]-v2[i]);
                directions(i,9) = (v3[i]-v2[i]);
                directions(i,10) = (directions(i,7)+directions(i,8))/2.;
                directions(i,11) = (directions(i,8)+directions(i,9))/2.;
                directions(i,12) = (directions(i,7)+directions(i,9))/2.;
                directions(i,13) = (directions(i,10)+directions(i,11)+directions(i,12))/3.;
                //face 2 face diagonal
                
                directions(i,14) = v1[i];
                directions(i,15) = v2[i];
                directions(i,16) = v3[i];
                directions(i,17) = (directions(i,14)+directions(i,15))/2.;
                directions(i,18) = (directions(i,15)+directions(i,16))/2.;
                directions(i,19) = (directions(i,14)+directions(i,16))/2.;
                directions(i,20) = (directions(i,17)+directions(i,18)+directions(i,19))/3.;
                //face 3
                directions(i,21) = -v1[i];
                directions(i,22) = (v2[i]-v1[i]);
                directions(i,23) = (v3[i]-v1[i]);
                directions(i,24) = (directions(i,21)+directions(i,22))/2.;
                directions(i,25) = (directions(i,22)+directions(i,23))/2.;
                directions(i,26) = (directions(i,21)+directions(i,23))/2.;
                directions(i,27) = (directions(i,24)+directions(i,25)+directions(i,26))/3.;
                
                //arestas
                directions(i,28) = v1[i];
                directions(i,29) = (v2[i]-v1[i]);
                directions(i,30) = -v2[i];
                directions(i,31) = v3[i];
                directions(i,32) = (v3[i]-v1[i]);
                directions(i,33) = (v3[i]-v2[i]);
                
                //faces
                directions(i,34) = v1[i];
                directions(i,35) = v2[i];
                directions(i,36) = v1[i];
                directions(i,37) = v3[i];
                directions(i,38) = (v2[i]-v1[i]);
                directions(i,39) = (v3[i]-v1[i]);//v3[i]-0.5*(v1[i]+v2[i]);//
                directions(i,40) = v2[i];
                directions(i,41) = v3[i];
                
                directions(i,42) = v1[i];
                directions(i,43) = v2[i];
                directions(i,44) = v3[i];
                
            }        

        } 

    }